

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int codeDistinct(Parse *pParse,int eTnctType,int iTab,int addrRepeat,ExprList *pEList,int regElem)

{
  uint p2;
  Vdbe *p;
  Op *pOVar1;
  byte bVar2;
  int iVar3;
  CollSeq *zP4;
  int p2_00;
  int iVar4;
  ulong uVar5;
  ExprList_item *pEVar6;
  int op;
  
  if (eTnctType == 1) {
    iTab = 0;
  }
  else {
    p2 = pEList->nExpr;
    p = pParse->pVdbe;
    if (eTnctType == 2) {
      iVar4 = pParse->nMem;
      iTab = iVar4 + 1;
      pParse->nMem = iVar4 + p2;
      if (0 < (int)p2) {
        iVar3 = p->nOp;
        pEVar6 = pEList->a;
        uVar5 = 0;
        do {
          zP4 = sqlite3ExprCollSeq(pParse,pEVar6->pExpr);
          if ((long)uVar5 < (long)(int)p2 + -1) {
            op = 0x34;
            p2_00 = iVar3 + p2;
          }
          else {
            op = 0x35;
            p2_00 = addrRepeat;
          }
          sqlite3VdbeAddOp3(p,op,regElem + (int)uVar5,p2_00,iVar4 + 1 + (int)uVar5);
          sqlite3VdbeChangeP4(p,-1,(char *)zP4,-2);
          if (0 < (long)p->nOp) {
            p->aOp[(long)p->nOp + -1].p5 = 0x80;
          }
          uVar5 = uVar5 + 1;
          pEVar6 = pEVar6 + 1;
        } while (p2 != uVar5);
      }
      sqlite3VdbeAddOp3(p,0x50,regElem,iTab,p2 - 1);
    }
    else {
      if (pParse->nTempReg == '\0') {
        iVar4 = pParse->nMem + 1;
        pParse->nMem = iVar4;
      }
      else {
        bVar2 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar2;
        iVar4 = pParse->aTempReg[bVar2];
      }
      iVar3 = sqlite3VdbeAddOp3(p,0x1d,iTab,addrRepeat,regElem);
      if (p->db->mallocFailed == '\0') {
        pOVar1 = p->aOp;
        pOVar1[iVar3].p4type = -3;
        pOVar1[iVar3].p4.i = p2;
      }
      sqlite3VdbeAddOp3(p,0x61,regElem,p2,iVar4);
      iVar3 = sqlite3VdbeAddOp3(p,0x8a,iTab,iVar4,regElem);
      if (p->db->mallocFailed == '\0') {
        pOVar1 = p->aOp;
        pOVar1[iVar3].p4type = -3;
        pOVar1[iVar3].p4.i = p2;
      }
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = 0x10;
      }
      if (iVar4 != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = iVar4;
        }
      }
    }
  }
  return iTab;
}

Assistant:

static int codeDistinct(
  Parse *pParse,     /* Parsing and code generating context */
  int eTnctType,     /* WHERE_DISTINCT_* value */
  int iTab,          /* A sorting index used to test for distinctness */
  int addrRepeat,    /* Jump to here if not distinct */
  ExprList *pEList,  /* Expression for each element */
  int regElem        /* First element */
){
  int iRet = 0;
  int nResultCol = pEList->nExpr;
  Vdbe *v = pParse->pVdbe;

  switch( eTnctType ){
    case WHERE_DISTINCT_ORDERED: {
      int i;
      int iJump;              /* Jump destination */
      int regPrev;            /* Previous row content */

      /* Allocate space for the previous row */
      iRet = regPrev = pParse->nMem+1;
      pParse->nMem += nResultCol;

      iJump = sqlite3VdbeCurrentAddr(v) + nResultCol;
      for(i=0; i<nResultCol; i++){
        CollSeq *pColl = sqlite3ExprCollSeq(pParse, pEList->a[i].pExpr);
        if( i<nResultCol-1 ){
          sqlite3VdbeAddOp3(v, OP_Ne, regElem+i, iJump, regPrev+i);
          VdbeCoverage(v);
        }else{
          sqlite3VdbeAddOp3(v, OP_Eq, regElem+i, addrRepeat, regPrev+i);
          VdbeCoverage(v);
         }
        sqlite3VdbeChangeP4(v, -1, (const char *)pColl, P4_COLLSEQ);
        sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
      }
      assert( sqlite3VdbeCurrentAddr(v)==iJump || pParse->db->mallocFailed );
      sqlite3VdbeAddOp3(v, OP_Copy, regElem, regPrev, nResultCol-1);
      break;
    }

    case WHERE_DISTINCT_UNIQUE: {
      /* nothing to do */
      break;
    }

    default: {
      int r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp4Int(v, OP_Found, iTab, addrRepeat, regElem, nResultCol);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regElem, nResultCol, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iTab, r1, regElem, nResultCol);
      sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
      sqlite3ReleaseTempReg(pParse, r1);
      iRet = iTab;
      break;
    }
  }

  return iRet;
}